

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void hydro_memzero(void *pnt,size_t len)

{
  size_t sVar1;
  uchar *pnt_;
  
  if (len != 0) {
    sVar1 = 0;
    do {
      *(undefined1 *)((long)pnt + sVar1) = 0;
      sVar1 = sVar1 + 1;
    } while (len != sVar1);
  }
  return;
}

Assistant:

void
hydro_memzero(void *pnt, size_t len)
{
#ifdef HAVE_EXPLICIT_BZERO
    explicit_bzero(pnt, len);
#else
    volatile unsigned char *volatile pnt_ = (volatile unsigned char *volatile) pnt;
    size_t i                              = (size_t) 0U;

    while (i < len) {
        pnt_[i++] = 0U;
    }
#endif
}